

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O2

list * make_file_list(char *buf)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  size_t __n;
  DIR *__dirp;
  dirent *pdVar8;
  list *__ptr;
  bool bVar9;
  char local_8e8 [8];
  char fl_name [1026];
  char local_4d8 [8];
  char prefixx [1025];
  stat statbuf;
  list *local_38;
  
  sVar4 = strlen(buf);
  if ((sVar4 == 0) || (buf[sVar4 - 1] != '.')) {
    pcVar5 = adjustname(buf,1);
    if (pcVar5 == (char *)0x0) {
      return (list *)0x0;
    }
    if ((sVar4 == 0) || (buf[sVar4 - 1] == '/')) goto LAB_001103b1;
  }
  else {
    buf[sVar4 - 1] = 'x';
    pcVar5 = adjustname(buf,1);
    buf[sVar4 - 1] = '.';
    if (pcVar5 == (char *)0x0) {
      return (list *)0x0;
    }
  }
  pcVar6 = strrchr(pcVar5,0x2f);
  if (pcVar6 == (char *)0x0) {
    return (list *)0x0;
  }
  *pcVar6 = '\0';
  if (*pcVar5 == '\0') {
    pcVar5 = "/";
  }
LAB_001103b1:
  uVar7 = strlcpy(local_4d8,buf,0x401);
  if (uVar7 < 0x401) {
    pcVar6 = strrchr(local_4d8,0x2f);
    if (pcVar6 == (char *)0x0) {
      local_4d8[0] = '\0';
    }
    else {
      pcVar6[1] = '\0';
    }
    sVar4 = strlen(local_4d8);
    __n = strlen(buf + sVar4);
    if ((sVar4 < 0x302) && (__dirp = opendir(pcVar5), __dirp != (DIR *)0x0)) {
      local_38 = (list *)0x0;
LAB_00110439:
      do {
        pdVar8 = readdir(__dirp);
        if (pdVar8 == (dirent *)0x0) {
LAB_00110562:
          closedir(__dirp);
          return local_38;
        }
        pcVar5 = pdVar8->d_name;
        iVar2 = strncmp(buf + sVar4,pcVar5,__n);
      } while (iVar2 != 0);
      uVar1 = pdVar8->d_type;
      if (uVar1 == '\n') {
LAB_0011047b:
        iVar2 = dirfd(__dirp);
        iVar2 = fstatat(iVar2,pcVar5,(stat *)(prefixx + 0x400),0);
        bVar9 = ((uint)statbuf.st_nlink & 0xf000) == 0x4000;
        if (iVar2 < 0) goto LAB_00110439;
      }
      else {
        bVar9 = true;
        if (uVar1 != '\x04') {
          if (uVar1 == '\0') goto LAB_0011047b;
          bVar9 = false;
        }
      }
      __ptr = (list *)malloc(0x10);
      if (__ptr == (list *)0x0) {
        free_file_list(local_38);
        local_38 = (list *)0x0;
        goto LAB_00110562;
      }
      pcVar6 = "";
      if (bVar9) {
        pcVar6 = "/";
      }
      uVar3 = snprintf(local_8e8,0x402,"%s%s%s",local_4d8,pcVar5,pcVar6);
      if (uVar3 < 0x402) {
        (__ptr->l_p).l_nxt = local_38;
        pcVar5 = strdup(local_8e8);
        __ptr->l_name = pcVar5;
        local_38 = __ptr;
      }
      else {
        free(__ptr);
      }
      goto LAB_00110439;
    }
  }
  return (list *)0x0;
}

Assistant:

struct list *
make_file_list(char *buf)
{
	char		*dir, *file, *cp;
	size_t		 len, preflen;
	int		 ret;
	DIR		*dirp;
	struct dirent	*dent;
	struct list	*last, *current;
	char		 fl_name[NFILEN + 2];
	char		 prefixx[NFILEN + 1];

	/*
	 * We need three different strings:

	 * dir - the name of the directory containing what the user typed.
	 *  Must be a real unix file name, e.g. no ~user, etc..
	 *  Must not end in /.
	 * prefix - the portion of what the user typed that is before the
	 *  names we are going to find in the directory.  Must have a
	 * trailing / if the user typed it.
	 * names from the directory - We open dir, and return prefix
	 * concatenated with names.
	 */

	/* first we get a directory name we can look up */
	/*
	 * Names ending in . are potentially odd, because adjustname will
	 * treat foo/bar/.. as a foo/, whereas we are
	 * interested in names starting with ..
	 */
	len = strlen(buf);
	if (len && buf[len - 1] == '.') {
		buf[len - 1] = 'x';
		dir = adjustname(buf, TRUE);
		buf[len - 1] = '.';
	} else
		dir = adjustname(buf, TRUE);
	if (dir == NULL)
		return (NULL);
	/*
	 * If the user typed a trailing / or the empty string
	 * he wants us to use his file spec as a directory name.
	 */
	if (len && buf[len - 1] != '/') {
		file = strrchr(dir, '/');
		if (file) {
			*file = '\0';
			if (*dir == '\0')
				dir = "/";
		} else
			return (NULL);
	}
	/* Now we get the prefix of the name the user typed. */
	if (strlcpy(prefixx, buf, sizeof(prefixx)) >= sizeof(prefixx))
		return (NULL);
	cp = strrchr(prefixx, '/');
	if (cp == NULL)
		prefixx[0] = '\0';
	else
		cp[1] = '\0';

	preflen = strlen(prefixx);
	/* cp is the tail of buf that really needs to be compared. */
	cp = buf + preflen;
	len = strlen(cp);

	/*
	 * Now make sure that file names will fit in the buffers allocated.
	 * SV files are fairly short.  For BSD, something more general would
	 * be required.
	 */
	if (preflen > NFILEN - MAXNAMLEN)
		return (NULL);

	/* loop over the specified directory, making up the list of files */

	/*
	 * Note that it is worth our time to filter out names that don't
	 * match, even though our caller is going to do so again, and to
	 * avoid doing the stat if completion is being done, because stat'ing
	 * every file in the directory is relatively expensive.
	 */

	dirp = opendir(dir);
	if (dirp == NULL)
		return (NULL);
	last = NULL;

	while ((dent = readdir(dirp)) != NULL) {
		int isdir;
		if (strncmp(cp, dent->d_name, len) != 0)
			continue;
		isdir = 0;
		if (dent->d_type == DT_DIR) {
			isdir = 1;
		} else if (dent->d_type == DT_LNK ||
			    dent->d_type == DT_UNKNOWN) {
			struct stat	statbuf;

			if (fstatat(dirfd(dirp), dent->d_name, &statbuf, 0) < 0)
				continue;
			if (S_ISDIR(statbuf.st_mode))
				isdir = 1;
		}

		if ((current = malloc(sizeof(struct list))) == NULL) {
			free_file_list(last);
			closedir(dirp);
			return (NULL);
		}
		ret = snprintf(fl_name, sizeof(fl_name),
		    "%s%s%s", prefixx, dent->d_name, isdir ? "/" : "");
		if (ret < 0 || ret >= sizeof(fl_name)) {
			free(current);
			continue;
		}
		current->l_next = last;
		current->l_name = strdup(fl_name);
		last = current;
	}
	closedir(dirp);

	return (last);
}